

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arcflow.cpp
# Opt level: O0

int __thiscall Arcflow::init(Arcflow *this,EVP_PKEY_CTX *ctx)

{
  undefined4 uVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  int extraout_EAX;
  runtime_error *prVar5;
  reference pvVar6;
  reference pvVar7;
  reference __b;
  int *piVar8;
  reference pvVar9;
  size_type sVar10;
  clock_t cVar11;
  char local_3d8 [8];
  char _error_msg__2 [256];
  int na2;
  int nv2;
  int na1;
  int nv1;
  char _error_msg__1 [256];
  int local_1bc;
  value_type_conflict local_1b8;
  int value;
  int nbits;
  int i_1;
  allocator<int> local_195;
  value_type_conflict local_194;
  vector<int,_std::allocator<int>_> local_190;
  int local_174;
  int local_170;
  int i;
  int it;
  int maxb;
  vector<int,_std::allocator<int>_> max_state;
  int local_148;
  int t;
  int d;
  char local_118 [8];
  char _error_msg_ [256];
  Instance *_inst_local;
  Arcflow *this_local;
  
  _error_msg_._248_8_ = ctx;
  if ((this->ready & 1U) != 0) {
    snprintf(local_118,0x100,"AssertionError: assertion `%s` failed in \"%s\" line %d",
             "ready == false",
             "/workspace/llm4binary/github/license_c_cmakelists/fdabrandao[P]vpsolver/src/arcflow.cpp"
             ,0x1f);
    prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar5,local_118);
    __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  Instance::operator=(&this->inst,(Instance *)ctx);
  this->LOSS = (this->inst).nsizes;
  this->label_size = (this->inst).ndims;
  Instance::sorted_items((vector<Item,_std::allocator<Item>_> *)&d,&this->inst);
  std::vector<Item,_std::allocator<Item>_>::operator=
            (&this->sitems,(vector<Item,_std::allocator<Item>_> *)&d);
  std::vector<Item,_std::allocator<Item>_>::~vector((vector<Item,_std::allocator<Item>_> *)&d);
  t = 0;
  std::vector<int,_std::allocator<int>_>::resize(&this->maxW,(long)this->label_size,&t);
  for (local_148 = 0; local_148 < (this->inst).ndims; local_148 = local_148 + 1) {
    for (max_state.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
         _M_end_of_storage._4_4_ = 0;
        max_state.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage._4_4_ < (this->inst).nbtypes;
        max_state.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage._4_4_ =
             max_state.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
             ._M_end_of_storage._4_4_ + 1) {
      pvVar6 = std::vector<int,_std::allocator<int>_>::operator[](&this->maxW,(long)local_148);
      pvVar7 = std::
               vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               ::operator[](&(this->inst).Ws,
                            (long)max_state.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_end_of_storage._4_4_);
      __b = std::vector<int,_std::allocator<int>_>::operator[](pvVar7,(long)local_148);
      piVar8 = std::max<int>(pvVar6,__b);
      iVar2 = *piVar8;
      pvVar6 = std::vector<int,_std::allocator<int>_>::operator[](&this->maxW,(long)local_148);
      *pvVar6 = iVar2;
    }
  }
  std::vector<int,_std::allocator<int>_>::operator=(&this->max_label,&this->maxW);
  if (((this->inst).binary & 1U) != 0) {
    this->label_size = (this->inst).ndims + 1;
    max_state.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage._0_4_ = 0x7fffffff;
    std::vector<int,_std::allocator<int>_>::push_back
              (&this->max_label,
               (value_type_conflict *)
               &max_state.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
  }
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)&it,&this->maxW);
  std::vector<int,_std::allocator<int>_>::push_back
            ((vector<int,_std::allocator<int>_> *)&it,&(this->inst).nsizes);
  if (((this->inst).binary & 1U) == 0) {
    i = 0;
    for (local_170 = 0; local_170 < (this->inst).nsizes; local_170 = local_170 + 1) {
      pvVar9 = std::vector<Item,_std::allocator<Item>_>::operator[](&this->sitems,(long)local_170);
      piVar8 = std::max<int>(&i,&pvVar9->demand);
      i = *piVar8;
    }
    std::vector<int,_std::allocator<int>_>::push_back((vector<int,_std::allocator<int>_> *)&it,&i);
  }
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::resize(&this->weights,(long)(this->inst).nsizes);
  for (local_174 = 0; local_174 < (this->inst).nsizes; local_174 = local_174 + 1) {
    pvVar9 = std::vector<Item,_std::allocator<Item>_>::operator[](&this->sitems,(long)local_174);
    pvVar7 = std::
             vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             ::operator[](&this->weights,(long)local_174);
    std::vector<int,_std::allocator<int>_>::operator=(pvVar7,&pvVar9->w);
  }
  iVar2 = (this->inst).ndims;
  local_194 = 0;
  std::allocator<int>::allocator(&local_195);
  std::vector<int,_std::allocator<int>_>::vector(&local_190,(long)iVar2,&local_194,&local_195);
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::push_back(&this->weights,&local_190);
  std::vector<int,_std::allocator<int>_>::~vector(&local_190);
  std::allocator<int>::~allocator(&local_195);
  count_max_rep((vector<int,_std::allocator<int>_> *)&nbits,this,&this->maxW,0,0);
  std::vector<int,_std::allocator<int>_>::operator=
            (&this->max_rep,(vector<int,_std::allocator<int>_> *)&nbits);
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)&nbits);
  value = 0;
  while( true ) {
    iVar2 = value;
    sVar10 = std::vector<int,_std::allocator<int>_>::size((vector<int,_std::allocator<int>_> *)&it);
    if ((int)sVar10 <= iVar2) break;
    local_1b8 = 0;
    pvVar6 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)&it,(long)value);
    for (local_1bc = *pvVar6; local_1bc != 0; local_1bc = local_1bc >> 1) {
      local_1b8 = local_1b8 + 1;
    }
    std::vector<int,_std::allocator<int>_>::push_back(&this->hash_bits,&local_1b8);
    value = value + 1;
  }
  printf("Build (method = %d)\n",(ulong)(uint)(this->inst).method);
  if ((-4 < (this->inst).method) && ((this->inst).method < -2)) {
    build(this);
    iVar2 = NodeSet::size(&this->NS);
    uVar3 = iVar2 + (this->inst).nbtypes;
    sVar10 = std::vector<Arc,_std::allocator<Arc>_>::size(&this->A);
    iVar2 = NodeSet::size(&this->NS);
    uVar4 = (int)sVar10 + 1 + (iVar2 + -1) * (this->inst).nbtypes;
    cVar11 = clock();
    printf("  Step-3\' Graph: %d vertices and %d arcs (%.2fs)\n",
           (double)(cVar11 - this->tstart) / 1000000.0,(ulong)uVar3,(ulong)uVar4);
    final_compression_step(this);
    finalize(this);
    iVar2 = NodeSet::size(&this->NS);
    sVar10 = std::vector<int,_std::allocator<int>_>::size(&this->Ts);
    _error_msg__2._252_4_ = iVar2 + (int)sVar10;
    sVar10 = std::vector<Arc,_std::allocator<Arc>_>::size(&this->A);
    uVar1 = _error_msg__2._252_4_;
    _error_msg__2._248_4_ = (undefined4)sVar10;
    cVar11 = clock();
    printf("  Step-4\' Graph: %d vertices and %d arcs (%.2fs)\n",
           (double)(cVar11 - this->tstart) / 1000000.0,(ulong)(uint)uVar1,sVar10 & 0xffffffff);
    printf("  #V4/#V3 = %.2f\n",(double)(int)_error_msg__2._252_4_ / (double)(int)uVar3);
    printf("  #A4/#A3 = %.2f\n",(double)(int)_error_msg__2._248_4_ / (double)(int)uVar4);
    cVar11 = clock();
    printf("Ready! (%.2fs)\n",(double)(cVar11 - this->tstart) / 1000000.0);
    if ((this->ready & 1U) != 1) {
      snprintf(local_3d8,0x100,"AssertionError: assertion `%s` failed in \"%s\" line %d",
               "ready == true",
               "/workspace/llm4binary/github/license_c_cmakelists/fdabrandao[P]vpsolver/src/arcflow.cpp"
               ,0x5e);
      prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(prVar5,local_3d8);
      __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)&it);
    return extraout_EAX;
  }
  snprintf((char *)&na1,0x100,"AssertionError: assertion `%s` failed in \"%s\" line %d",
           "inst.method >= MIN_METHOD && inst.method <= MAX_METHOD",
           "/workspace/llm4binary/github/license_c_cmakelists/fdabrandao[P]vpsolver/src/arcflow.cpp"
           ,0x4d);
  prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(prVar5,(char *)&na1);
  __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void Arcflow::init(const Instance &_inst) {
	throw_assert(ready == false);
	inst = _inst;
	LOSS = inst.nsizes;
	label_size = inst.ndims;
	sitems = inst.sorted_items();
	maxW.resize(label_size, 0);
	for (int d = 0; d < inst.ndims; d++) {
		for (int t = 0; t < inst.nbtypes; t++) {
			maxW[d] = std::max(maxW[d], inst.Ws[t][d]);
		}
	}

	max_label = maxW;
	if (inst.binary) {
		label_size = inst.ndims + 1;
		max_label.push_back(INT_MAX);
	}

	std::vector<int> max_state = maxW;
	max_state.push_back(inst.nsizes);
	if (!inst.binary) {
		int maxb = 0;
		for (int it = 0; it < inst.nsizes; it++) {
			maxb = std::max(maxb, sitems[it].demand);
		}
		max_state.push_back(maxb);
	}

	weights.resize(inst.nsizes);
	for (int i = 0; i < inst.nsizes; i++) {
		weights[i] = sitems[i].w;
	}
	weights.push_back(std::vector<int>(inst.ndims, 0));  // loss arcs

	max_rep = count_max_rep(maxW, 0, 0);

	for (int i = 0; i < static_cast<int>(max_state.size()); i++) {
		int nbits = 0, value = max_state[i];
		while (value) {
			nbits++;
			value >>= 1;
		}
		hash_bits.push_back(nbits);
	}

	printf("Build (method = %d)\n", inst.method);
	throw_assert(inst.method >= MIN_METHOD && inst.method <= MAX_METHOD);

	build();  // build step-3' graph
	int nv1 = NS.size() + inst.nbtypes;
	int na1 = A.size() + (NS.size() - 1) * inst.nbtypes + 1;
	printf("  Step-3' Graph: %d vertices and %d arcs (%.2fs)\n",
		   nv1, na1, TIMEDIF(tstart));

	final_compression_step();  // create step-4' graph
	finalize();  // add the final loss arcs
	int nv2 = NS.size() + Ts.size();
	int na2 = A.size();
	printf("  Step-4' Graph: %d vertices and %d arcs (%.2fs)\n",
		   nv2, na2, TIMEDIF(tstart));
	printf("  #V4/#V3 = %.2f\n", nv2 / static_cast<double>(nv1));
	printf("  #A4/#A3 = %.2f\n", na2 / static_cast<double>(na1));
	printf("Ready! (%.2fs)\n", TIMEDIF(tstart));
	throw_assert(ready == true);
}